

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_ConvertToGrayScale(ConvertToGrayScaleForm3 ConvertToGrayScale)

{
  byte bVar1;
  const_reference pvVar2;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  undefined4 in_stack_ffffffffffffff28;
  uint32_t in_stack_ffffffffffffff2c;
  uint8_t value;
  Image *image;
  uint32_t in_stack_ffffffffffffff38;
  uint32_t width_;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar4;
  undefined1 local_b8 [7];
  uint8_t in_stack_ffffffffffffff4f;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  undefined4 local_80;
  undefined1 local_48 [40];
  code *local_8;
  
  image = (Image *)&stack0xffffffffffffffe0;
  uVar3 = 1;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff2c);
  width_ = 0;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image,0);
  uVar4 = CONCAT13(*pvVar2,(int3)in_stack_ffffffffffffff44);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar4,uVar3),width_,in_stack_ffffffffffffff38,
             (uint8_t)((ulong)image >> 0x38),(uint8_t)((ulong)image >> 0x30));
  Test_Helper::uniformRGBImage(in_stack_ffffffffffffff4f,(Image *)CONCAT44(uVar4,uVar3));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d1221);
  Unit_Test::generateRoi
            ((Image *)CONCAT44(uVar4,uVar3),(uint32_t *)CONCAT44(width_,in_stack_ffffffffffffff38),
             (uint32_t *)image,
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             (uint32_t *)0x1d1242);
  value = (uint8_t)(in_stack_ffffffffffffff2c >> 0x18);
  (*local_8)(local_b8,local_48,local_80,local_84,local_88,local_8c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,0);
  bVar1 = Unit_Test::verifyImage(image,value);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d129d);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d12aa);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)CONCAT44(uVar4,uVar3));
  return (bool)(bVar1 & 1);
}

Assistant:

bool form3_ConvertToGrayScale(ConvertToGrayScaleForm3 ConvertToGrayScale)
    {
        const std::vector < uint8_t > intensity = intensityArray( 1 );
        const PenguinV_Image::Image input  = uniformRGBImage( intensity[0] );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        const PenguinV_Image::Image output = ConvertToGrayScale( input, roiX, roiY, roiWidth, roiHeight );

        return verifyImage( output, intensity[0] );
    }